

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

Value * __thiscall Json::Value::operator[](Value *this,int index)

{
  Value *pVVar1;
  undefined8 extraout_RAX;
  ostringstream oss;
  string local_1a0;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  if (-1 < index) {
    pVVar1 = operator[](this,index);
    return pVVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,
             "in Json::Value::operator[](int index) const: index cannot be negative",0x45);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

const Value& Value::operator[](int index) const {
  JSON_ASSERT_MESSAGE(
      index >= 0,
      "in Json::Value::operator[](int index) const: index cannot be negative");
  return (*this)[ArrayIndex(index)];
}